

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall
CLI::App::add_flag_function
          (App *this,string *name,function<void_(unsigned_long)> *function,string *description)

{
  bool bVar1;
  Option *pOVar2;
  IncorrectConstruction *__return_storage_ptr__;
  string local_100;
  string local_e0;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_c0;
  string local_a0;
  Option *local_80;
  Option *opt;
  function<void_(unsigned_long)> local_68;
  undefined1 local_48 [8];
  callback_t fun;
  string *description_local;
  function<void_(unsigned_long)> *function_local;
  string *name_local;
  App *this_local;
  
  fun._M_invoker = (_Invoker_type)description;
  std::function<void_(unsigned_long)>::function(&local_68,function);
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_flag_function(std::__cxx11::string,std::function<void(unsigned_long)>,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)local_48,(anon_class_32_1_3a3b9956 *)&local_68);
  add_flag_function(std::__cxx11::string,std::function<void(unsigned_long)>,std::__cxx11::string)::
  {lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)#1}::~vector
            ((_lambda_std__vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>__1_ *)
             &local_68);
  ::std::__cxx11::string::string((string *)&local_a0,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_c0,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)local_48);
  ::std::__cxx11::string::string((string *)&local_e0,(string *)description);
  pOVar2 = add_option(this,&local_a0,&local_c0,&local_e0,false);
  ::std::__cxx11::string::~string((string *)&local_e0);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_c0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  local_80 = pOVar2;
  bVar1 = Option::get_positional(pOVar2);
  if (!bVar1) {
    Option::type_size(local_80,0);
    pOVar2 = local_80;
    std::
    function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
    ::~function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                 *)local_48);
    return pOVar2;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_100,(string *)name);
  IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_100);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,
              IncorrectConstruction::~IncorrectConstruction);
}

Assistant:

Option *add_flag_function(std::string name,
                              std::function<void(size_t)> function, ///< A function to call, void(size_t)
                              std::string description = "") {

        CLI::callback_t fun = [function](CLI::results_t res) {
            auto count = static_cast<size_t>(res.size());
            function(count);
            return true;
        };

        Option *opt = add_option(name, fun, description, false);
        if(opt->get_positional())
            throw IncorrectConstruction::PositionalFlag(name);
        opt->type_size(0);
        return opt;
    }